

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall perfetto::base::TempFile::~TempFile(TempFile *this)

{
  TempFile *this_local;
  
  Unlink(this);
  ::std::__cxx11::string::~string((string *)&this->path_);
  ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
  ::~ScopedResource(&this->fd_);
  return;
}

Assistant:

TempFile::~TempFile() {
  Unlink();
}